

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_decode_bytes(AMQPVALUE_DECODER_HANDLE handle,uchar *buffer,size_t size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  size_t used_bytes;
  LOGGER_LOG l;
  AMQPVALUE_DECODER_HANDLE_DATA *decoder_instance;
  size_t sStack_28;
  int result;
  size_t size_local;
  uchar *buffer_local;
  AMQPVALUE_DECODER_HANDLE handle_local;
  
  l = (LOGGER_LOG)handle;
  sStack_28 = size;
  size_local = (size_t)buffer;
  buffer_local = (uchar *)handle;
  if (((handle == (AMQPVALUE_DECODER_HANDLE)0x0) || (buffer == (uchar *)0x0)) || (size == 0)) {
    used_bytes = (size_t)xlogging_get_log_function();
    if ((LOGGER_LOG)used_bytes != (LOGGER_LOG)0x0) {
      (*(code *)used_bytes)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                 ,"amqpvalue_decode_bytes",0x1bd8,1,
                 "Bad arguments: decoder_instance = %p, buffer = %p, size = %lu",l,size_local,
                 sStack_28);
    }
    decoder_instance._4_4_ = 0x1bd9;
  }
  else {
    iVar1 = internal_decoder_decode_bytes(handle->internal_decoder,buffer,size,(size_t *)&l_1);
    if (iVar1 == 0) {
      decoder_instance._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"amqpvalue_decode_bytes",0x1be2,1,"Failed decoding bytes");
      }
      decoder_instance._4_4_ = 0x1be3;
    }
  }
  return decoder_instance._4_4_;
}

Assistant:

int amqpvalue_decode_bytes(AMQPVALUE_DECODER_HANDLE handle, const unsigned char* buffer, size_t size)
{
    int result;

    AMQPVALUE_DECODER_HANDLE_DATA* decoder_instance = (AMQPVALUE_DECODER_HANDLE_DATA*)handle;
    /* Codes_SRS_AMQPVALUE_01_320: [If handle or buffer are NULL, amqpvalue_decode_bytes shall return a non-zero value.] */
    if ((decoder_instance == NULL) ||
        (buffer == NULL) ||
        /* Codes_SRS_AMQPVALUE_01_321: [If size is 0, amqpvalue_decode_bytes shall return a non-zero value.] */
        (size == 0))
    {
        LogError("Bad arguments: decoder_instance = %p, buffer = %p, size = %lu",
            decoder_instance, buffer, (unsigned long)size);
        result = MU_FAILURE;
    }
    else
    {
        size_t used_bytes;

        /* Codes_SRS_AMQPVALUE_01_318: [amqpvalue_decode_bytes shall decode size bytes that are passed in the buffer argument.] */
        if (internal_decoder_decode_bytes(decoder_instance->internal_decoder, buffer, size, &used_bytes) != 0)
        {
            LogError("Failed decoding bytes");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_319: [On success, amqpvalue_decode_bytes shall return 0.] */
            result = 0;
        }
    }

    return result;
}